

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

uint32_t cpu_rddsp_mips(uint32_t mask_num,CPUMIPSState_conflict *env)

{
  uint uVar1;
  uint uVar2;
  uint32_t ruler;
  uint32_t i;
  long lVar3;
  uint8_t uVar4;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  undefined1 auVar5 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint8_t mask [6];
  
  ruler = 1;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    mask[lVar3] = (uint8_t)((ruler & mask_num) >> ((byte)lVar3 & 0x1f));
    ruler = ruler * 2;
  }
  uVar1 = (env->active_tc).DSPControl;
  uVar8 = SUB41(mask._0_4_,3);
  uVar7 = SUB41(mask._0_4_,2);
  uVar6 = SUB41(mask._0_4_,1);
  uVar4 = (uint8_t)mask._0_4_;
  auVar10[0] = -(uVar4 == '\x01');
  auVar10[1] = -(uVar4 == '\x01');
  auVar10[2] = -(uVar4 == '\x01');
  auVar10[3] = -(uVar4 == '\x01');
  auVar10[4] = -(uVar6 == '\x01');
  auVar10[5] = -(uVar6 == '\x01');
  auVar10[6] = -(uVar6 == '\x01');
  auVar10[7] = -(uVar6 == '\x01');
  auVar10[8] = -(uVar7 == '\x01');
  auVar10[9] = -(uVar7 == '\x01');
  auVar10[10] = -(uVar7 == '\x01');
  auVar10[0xb] = -(uVar7 == '\x01');
  auVar10[0xc] = -(uVar8 == '\x01');
  auVar10[0xd] = -(uVar8 == '\x01');
  auVar10[0xe] = -(uVar8 == '\x01');
  auVar10[0xf] = -(uVar8 == '\x01');
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar10 = auVar9 & auVar10 & _DAT_00b90110;
  uVar2 = uVar1 & 0xf000000;
  if (mask[4] != '\x01') {
    uVar2 = 0;
  }
  uVar1 = uVar1 & 0x4000;
  if (mask[5] != '\x01') {
    uVar1 = 0;
  }
  auVar5._0_8_ = auVar10._8_8_;
  auVar5._8_4_ = auVar10._8_4_;
  auVar5._12_4_ = auVar10._12_4_;
  return uVar1 | uVar2 | SUB164(auVar5 | auVar10,4) | SUB164(auVar5 | auVar10,0);
}

Assistant:

uint32_t cpu_rddsp(uint32_t mask_num, CPUMIPSState *env)
{
    uint8_t  mask[6];
    uint32_t ruler, i;
    target_ulong temp;
    target_ulong dsp;

    ruler = 0x01;
    for (i = 0; i < 6; i++) {
        mask[i] = (mask_num & ruler) >> i ;
        ruler = ruler << 1;
    }

    temp  = 0x00;
    dsp = env->active_tc.DSPControl;

    if (mask[0] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0x7F;
#else
        temp |= dsp & 0x3F;
#endif
    }

    if (mask[1] == 1) {
        temp |= dsp & 0x1F80;
    }

    if (mask[2] == 1) {
        temp |= dsp & 0x2000;
    }

    if (mask[3] == 1) {
        temp |= dsp & 0x00FF0000;
    }

    if (mask[4] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0xFF000000;
#else
        temp |= dsp & 0x0F000000;
#endif
    }

    if (mask[5] == 1) {
        temp |= dsp & 0x4000;
    }

    return temp;
}